

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::AssocArrayDeleteMethod::checkArguments
          (AssocArrayDeleteMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  bool bVar1;
  Compilation *this_00;
  size_type sVar2;
  Expression *in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  Args *in_RDI;
  ASTContext *in_R8;
  SourceRange in_stack_00000000;
  size_t in_stack_00000020;
  Type *indexType;
  Type *type;
  Compilation *comp;
  Type *pTVar3;
  Type *this_01;
  ASTContext *in_stack_ffffffffffffffa0;
  Expression *in_stack_ffffffffffffffa8;
  SystemSubroutine *in_stack_fffffffffffffff8;
  
  this_00 = ASTContext::getCompilation((ASTContext *)0xabcb99);
  pTVar3 = (Type *)0x0;
  this_01 = (Type *)0x1;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_fffffffffffffff8,in_R8,SUB81((ulong)in_RCX >> 0x38,0),in_RDI,
                     in_stack_00000000,in_stack_00000020,(size_t)indexType);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    bVar1 = SystemSubroutine::registerLValue(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if (bVar1) {
      sVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                        ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                         0xabcc43);
      if (1 < sVar2) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0)
        ;
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0xabcc67);
        pTVar3 = Type::getAssociativeIndexType(pTVar3);
        if (pTVar3 == (Type *)0x0) {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    (in_RDX,1);
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0xabcc9e);
          bVar1 = Type::isIntegral(this_01);
          if (!bVar1) {
            std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                      (in_RDX,1);
            pTVar3 = SystemSubroutine::badArg((SystemSubroutine *)this_00,in_R8,in_RCX);
            return pTVar3;
          }
        }
      }
      pTVar3 = Compilation::getVoidType(this_00);
    }
    else {
      pTVar3 = Compilation::getErrorType(this_00);
    }
  }
  else {
    pTVar3 = Compilation::getErrorType(this_00);
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 1))
            return comp.getErrorType();

        if (!registerLValue(*args[0], context))
            return comp.getErrorType();

        if (args.size() > 1) {
            auto& type = *args[0]->type;
            auto indexType = type.getAssociativeIndexType();
            if (!indexType && !args[1]->type->isIntegral())
                return badArg(context, *args[1]);
        }

        return comp.getVoidType();
    }